

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

int __thiscall
TSMuxer::writeTSFrames
          (TSMuxer *this,int pid,uint8_t *buffer,int64_t len,bool priorityData,bool payloadStart)

{
  pointer puVar1;
  uint8_t *puVar2;
  TSPacket *this_00;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  longlong pcr;
  ostream *poVar9;
  uint uVar10;
  size_t sVar11;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  size_t __n;
  uint local_54;
  mapped_type *local_50;
  uint8_t *local_48;
  long local_40;
  uint8_t *local_38;
  
  local_54 = pid;
  local_50 = std::
             map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
             ::operator[](&this->m_streamInfo,(key_type_conflict *)&local_54);
  uVar10 = CONCAT31(in_register_00000089,payloadStart) << 0xe;
  iVar8 = 0;
  local_48 = buffer + len;
  while (puVar2 = local_48, buffer < local_48) {
    if ((this->m_cbrBitrate != -1) && (this->m_lastPCR != -1)) {
      pcr = llround(((double)(this->m_lastPCR + (long)this->m_pcrBits) * 90000.0) /
                    (double)this->m_cbrBitrate);
      if ((this->m_lastPCR != -1) && ((long)this->m_pcr_delta <= pcr - this->m_lastPCR)) {
        this->m_pcrBits = 0;
        writePATPMT(this,pcr,false);
        writePCR(this,pcr);
        if ((this->m_lastPESDTS != -1) && (this->m_lastPESDTS < this->m_lastPCR)) {
          std::operator<<((ostream *)&std::cerr,"VBV buffer overflow at position ");
          poVar9 = std::ostream::_M_insert<double>
                             ((double)(this->m_lastPCR - this->m_fixed_pcr_offset) / 90000.0);
          poVar9 = std::operator<<(poVar9," sec");
          std::endl<char,std::char_traits<char>>(poVar9);
          sLastMsg = true;
        }
      }
    }
    iVar6 = this->m_outBufLen;
    if (this->m_m2tsMode == true) {
      iVar6 = iVar6 + 4;
      this->m_outBufLen = iVar6;
      this->m_processedBlockSize = this->m_processedBlockSize + 4;
      this->m_pcrBits = this->m_pcrBits + 0x20;
    }
    sVar11 = (long)puVar2 - (long)buffer;
    puVar5 = this->m_outBuf;
    local_40 = (long)iVar6;
    puVar2 = puVar5 + local_40;
    puVar2[0] = 'G';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\x10';
    iVar6 = this->m_outBufLen;
    this_00 = (TSPacket *)(puVar5 + iVar6);
    local_38 = buffer;
    iVar7 = TSPacket::getHeaderSize(this_00);
    __n = (size_t)(0xbc - iVar7);
    *(uint *)(puVar5 + iVar6) =
         (local_54 & 0xff) << 0x10 | local_54 & 0x1f00 | *(uint *)(puVar5 + iVar6) & 0xff00e0ff;
    uVar3 = local_50->m_tsCnt;
    local_50->m_tsCnt = uVar3 + 1;
    uVar4 = *(uint *)(puVar5 + iVar6);
    uVar10 = uVar10 | CONCAT31(in_register_00000081,priorityData) << 0xd | (uVar3 & 0xf) << 0x18 |
             uVar4 & 0xf0ff9fff;
    *(uint *)(puVar5 + iVar6) = uVar10;
    if ((long)sVar11 < (long)__n) {
      if ((uVar4 >> 0x1d & 1) == 0) {
        *(uint *)this_00 = uVar10 | 0x20000000;
        if (__n - sVar11 == 1) {
          *(undefined1 *)&this_00->adaptiveField = 0;
          __n = __n - 1;
        }
        else {
          puVar5 = puVar5 + local_40 + 4;
          puVar5[0] = '\x01';
          puVar5[1] = '\0';
          puVar5[2] = '\0';
          puVar5[3] = '\0';
          __n = __n - 2;
        }
      }
      iVar6 = TSPacket::getHeaderSize(this_00);
      memset(&this_00->field_0x0 + iVar6,0xff,__n - sVar11);
      *(char *)&this_00->adaptiveField =
           (char)(__n - sVar11) + (char)*(undefined2 *)&this_00->adaptiveField;
      __n = sVar11;
    }
    iVar6 = TSPacket::getHeaderSize(this_00);
    puVar2 = local_38;
    memcpy(this->m_outBuf + (long)iVar6 + (long)this->m_outBufLen,local_38,__n);
    this->m_outBufLen = this->m_outBufLen + 0xbc;
    this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
    buffer = puVar2 + __n;
    this->m_pcrBits = this->m_pcrBits + 0x5e0;
    puVar1 = (this->m_muxedPacketCnt).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    *puVar1 = *puVar1 + 1;
    writeOutBuffer(this);
    iVar8 = iVar8 + 1;
    uVar10 = 0;
  }
  return iVar8;
}

Assistant:

int TSMuxer::writeTSFrames(const int pid, const uint8_t* buffer, const int64_t len, const bool priorityData,
                           bool payloadStart)
{
    int result = 0;

    const uint8_t* curPos = buffer;
    const uint8_t* end = buffer + len;

    const bool tsPriority = priorityData;
    StreamInfo& streamInfo = m_streamInfo[pid];

    while (curPos < end)
    {
        if (m_cbrBitrate != -1 && m_lastPCR != -1)
        {
            const auto newPCR = llround(static_cast<double>(m_lastPCR + m_pcrBits) * 90000.0 / m_cbrBitrate);
            if (newPCR - m_lastPCR >= m_pcr_delta && m_lastPCR != -1)
            {
                m_pcrBits = 0;
                writePATPMT(newPCR);
                writePCR(newPCR);
                if (m_lastPESDTS != -1 && m_lastPCR > m_lastPESDTS)
                {
                    LTRACE(LT_ERROR, 2,
                           "VBV buffer overflow at position " << (double)(m_lastPCR - m_fixed_pcr_offset) / 90000.0
                                                              << " sec");
                }
            }
        }

        if (m_m2tsMode)
        {
            m_outBufLen += 4;
            m_processedBlockSize += 4;
            m_pcrBits += 4 * 8;
        }
        const int64_t tmpBufferLen = end - curPos;
        const auto initTS = reinterpret_cast<uint32_t*>(m_outBuf + m_outBufLen);
        *initTS = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
        const auto tsPacket = reinterpret_cast<TSPacket*>(m_outBuf + m_outBufLen);
        int64_t payloadLen = TS_FRAME_SIZE - tsPacket->getHeaderSize();
        tsPacket->setPID(pid);
        tsPacket->counter = streamInfo.m_tsCnt++;
        tsPacket->payloadStart = payloadStart;  // curPos == buffer;
        payloadStart = false;
        tsPacket->priority = tsPriority;
        if (tmpBufferLen < payloadLen)
        {
            // insert padding bytes
            if (!tsPacket->afExists)
            {
                tsPacket->afExists = 1;
                if (payloadLen - tmpBufferLen == 1)
                {
                    tsPacket->adaptiveField.length = 0;
                    payloadLen--;
                }
                else
                {
                    initTS[1] = 0x01;  // zero all af flags, set af len to 1.
                    payloadLen -= 2;
                }
            }
            memset(reinterpret_cast<uint8_t*>(tsPacket) + tsPacket->getHeaderSize(), 0xff, payloadLen - tmpBufferLen);
            tsPacket->adaptiveField.length += static_cast<unsigned>(payloadLen - tmpBufferLen);
            payloadLen = tmpBufferLen;
        }
        const int tsHeaderSize = tsPacket->getHeaderSize();
        memcpy(m_outBuf + m_outBufLen + tsHeaderSize, curPos, payloadLen);

        curPos += payloadLen;
        m_outBufLen += TS_FRAME_SIZE;
        m_processedBlockSize += TS_FRAME_SIZE;
        m_pcrBits += TS_FRAME_SIZE * 8;
        m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
        writeOutBuffer();
        result++;
    }
    return result;
}